

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void fullinc(lua_State *L,global_State *g)

{
  global_State *g_local;
  lua_State *L_local;
  
  if (g->gcstate < 3) {
    entersweep(L);
  }
  luaC_runtilstate(L,0x100);
  luaC_runtilstate(L,1);
  g->gcstate = '\x01';
  luaC_runtilstate(L,0x80);
  luaC_runtilstate(L,0x100);
  setpause(g);
  return;
}

Assistant:

static void fullinc (lua_State *L, global_State *g) {
  if (keepinvariant(g))  /* black objects? */
    entersweep(L); /* sweep everything to turn them back to white */
  /* finish any pending sweep phase to start a new cycle */
  luaC_runtilstate(L, bitmask(GCSpause));
  luaC_runtilstate(L, bitmask(GCSpropagate));  /* start new cycle */
  g->gcstate = GCSenteratomic;  /* go straight to atomic phase */
  luaC_runtilstate(L, bitmask(GCScallfin));  /* run up to finalizers */
  /* estimate must be correct after a full GC cycle */
  lua_assert(g->GCestimate == gettotalbytes(g));
  luaC_runtilstate(L, bitmask(GCSpause));  /* finish collection */
  setpause(g);
}